

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalPredictiveDecoder *this,CornerIndex corner)

{
  ulong uVar1;
  CornerIndex CVar2;
  int *piVar3;
  CornerIndex CVar4;
  int iVar5;
  CornerTable *pCVar6;
  pointer piVar7;
  ulong uVar8;
  
  CVar4.value_ = corner.value_;
  if (corner.value_ != 0xffffffff) {
    CVar4.value_ = corner.value_ - 2;
    if (0x55555555 < (corner.value_ + 1) * -0x55555555) {
      CVar4.value_ = corner.value_ + 1;
    }
  }
  CVar2.value_ = corner.value_;
  if (corner.value_ != 0xffffffff) {
    CVar2.value_ = ((corner.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner.value_;
  }
  uVar1 = 0xffffffff;
  switch(this->last_symbol_) {
  case 0:
  case 1:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (CVar4.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar4.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = piVar7 + uVar8;
    *piVar3 = *piVar3 + 1;
    uVar8 = 0xffffffff;
    if (CVar2.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar2.value_].value_;
    }
    piVar3 = piVar7 + uVar8;
    break;
  default:
    goto switchD_00125d88_caseD_2;
  case 3:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (CVar4.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar4.value_].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 2;
    uVar8 = 0xffffffff;
    if (CVar2.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar2.value_].value_;
    }
    piVar3 = piVar7 + uVar8;
    break;
  case 5:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (CVar4.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar4.value_].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 1;
    goto LAB_00125ead;
  case 7:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 2;
    uVar8 = 0xffffffff;
    if (CVar4.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar4.value_].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 2;
LAB_00125ead:
    uVar8 = 0xffffffff;
    if (CVar2.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar2.value_].value_;
    }
    piVar3 = piVar7 + uVar8;
    iVar5 = 2;
    goto LAB_00125ec8;
  }
  iVar5 = 1;
LAB_00125ec8:
  *piVar3 = *piVar3 + iVar5;
switchD_00125d88_caseD_2:
  if ((this->last_symbol_ != 5) && (this->last_symbol_ != 0)) {
    this->predicted_symbol_ = -1;
    return;
  }
  CVar4.value_ = corner.value_;
  if (corner.value_ != 0xffffffff) {
    CVar4.value_ = corner.value_ - 2;
    if (0x55555555 < (corner.value_ + 1) * -0x55555555) {
      CVar4.value_ = corner.value_ + 1;
    }
  }
  if (CVar4.value_ != 0xffffffff) {
    uVar1 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[CVar4.value_].value_;
  }
  if ((this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] < 6) {
    this->predicted_symbol_ = 5;
    return;
  }
  this->predicted_symbol_ = 0;
  return;
}

Assistant:

inline void NewActiveCornerReached(CornerIndex corner) {
    const CornerIndex next = corner_table_->Next(corner);
    const CornerIndex prev = corner_table_->Previous(corner);
    // Update valences.
    switch (last_symbol_) {
      case TOPOLOGY_C:
      case TOPOLOGY_S:
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_R:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 2;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      default:
        break;
    }
    // Compute the new predicted symbol.
    if (last_symbol_ == TOPOLOGY_C || last_symbol_ == TOPOLOGY_R) {
      const VertexIndex pivot =
          corner_table_->Vertex(corner_table_->Next(corner));
      if (vertex_valences_[pivot.value()] < 6) {
        predicted_symbol_ = TOPOLOGY_R;
      } else {
        predicted_symbol_ = TOPOLOGY_C;
      }
    } else {
      predicted_symbol_ = -1;
    }
  }